

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.h
# Opt level: O2

pair<unsigned_long,_long> __thiscall
duckdb_skiplistlib::skip_list::
Node<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>::_Pool::
Release(_Pool *this,
       Node<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
       *pNode)

{
  Node<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_> *pNVar1;
  pair<unsigned_long,_long> pVar2;
  
  pVar2 = pNode->_value;
  pNVar1 = this->cache;
  this->cache = pNode;
  if (pNVar1 != (Node<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
                 *)0x0) {
    std::
    _Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>_>_>
    ::~_Vector_base((_Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>_>_>
                     *)&pNVar1->_nodeRefs);
  }
  operator_delete(pNVar1);
  return pVar2;
}

Assistant:

T Release(Node *pNode) {
			T result = pNode->value();
			std::swap(pNode, cache);
			delete pNode;
			return result;
		}